

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O2

int __thiscall FParseContext::GetToken(FParseContext *this,char **sourcep,FParseToken *yylval)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  long lStack_b0;
  int buildup;
  char token [80];
  
  pcVar6 = *sourcep;
  iVar10 = this->SourceLine;
LAB_00468dfb:
  pcVar7 = pcVar6 + 7;
  while( true ) {
    pcVar6 = pcVar7;
    *sourcep = pcVar6 + -6;
    cVar1 = pcVar6[-7];
    iVar8 = (int)cVar1;
    iVar3 = isspace(iVar8);
    if ((cVar1 == '\0') || (iVar3 == 0)) break;
    pcVar7 = pcVar6 + 1;
    if (cVar1 == '\n') goto code_r0x00468e2a;
  }
  iVar3 = 0;
  if (cVar1 == '\0') {
    return 0;
  }
  if (iVar8 - 0x30U < 10) {
    if (cVar1 == '0') {
      *sourcep = pcVar6 + -5;
      if ((pcVar6[-6] & 0xdfU) == 0x58) {
        lVar11 = strtol(pcVar6 + -5,sourcep,0x10);
        yylval->val = (int)lVar11;
        return this->TokenTrans[9];
      }
    }
    *sourcep = pcVar6 + -7;
    lVar11 = strtol(pcVar6 + -7,(char **)token,10);
    yylval->val = (int)lVar11;
    if (*(char *)CONCAT71(token._1_7_,token[0]) == '.') {
      dVar12 = strtod(*sourcep,sourcep);
      yylval->fval = dVar12;
      lStack_b0 = 0x28;
    }
    else {
      *sourcep = (char *)CONCAT71(token._1_7_,token[0]);
      lStack_b0 = 0x24;
    }
    return *(int *)((long)this->TokenTrans + lStack_b0);
  }
  iVar4 = isalpha(iVar8);
  if (iVar4 != 0) {
    buildup = 0;
    lVar11 = 2;
    pcVar6 = pcVar6 + -6;
    token[0] = cVar1;
    goto LAB_00468fb7;
  }
  switch(cVar1) {
  case '\"':
    pcVar6 = pcVar6 + -6;
    uVar5 = 0;
    while( true ) {
      *sourcep = pcVar6 + 1;
      cVar1 = *pcVar6;
      if ((cVar1 == '\0') || (cVar1 == '\"')) break;
      yylval->sym[uVar5] = cVar1;
      uVar5 = uVar5 + 1;
      pcVar6 = *sourcep;
    }
    yylval->sym[uVar5 & 0xffffffff] = '\0';
    return this->TokenTrans[0x19];
  case '#':
    iVar10 = strncasecmp(pcVar6 + -6,"include",7);
    if (iVar10 == 0) {
      *sourcep = pcVar6 + 1;
      return this->TokenTrans[0x1a];
    }
    iVar10 = strncasecmp(pcVar6 + -6,"define",6);
    if (iVar10 != 0) {
      return 0;
    }
    *sourcep = pcVar6;
    return this->TokenTrans[0x1b];
  case '$':
  case '\'':
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    goto switchD_00468e80_caseD_24;
  case '%':
    return this->TokenTrans[8];
  case '&':
    return this->TokenTrans[3];
  case '(':
    return this->TokenTrans[0xb];
  case ')':
    return this->TokenTrans[0xc];
  case '*':
    return this->TokenTrans[6];
  case '+':
    return this->TokenTrans[5];
  case ',':
    return this->TokenTrans[0x10];
  case '-':
    return this->TokenTrans[4];
  case '/':
    *sourcep = pcVar6 + -5;
    pcVar7 = pcVar6 + -5;
    if (pcVar6[-6] == '/') goto LAB_00468e95;
    if (pcVar6[-6] != '*') {
      *sourcep = pcVar6 + -6;
      return this->TokenTrans[7];
    }
    pcVar6 = pcVar6 + -5;
    while( true ) {
      while( true ) {
        pcVar7 = pcVar6 + 1;
        *sourcep = pcVar7;
        cVar1 = *pcVar6;
        if (cVar1 == '\0') {
          return 0;
        }
        if (cVar1 == '*') break;
        pcVar6 = pcVar7;
        if (cVar1 == '\n') {
          iVar10 = iVar10 + 1;
          this->SourceLine = iVar10;
        }
      }
      pcVar6 = pcVar6 + 2;
      *sourcep = pcVar6;
      if (*pcVar7 == '\0') {
        return 0;
      }
      if (*pcVar7 == '/') break;
      *sourcep = pcVar7;
      pcVar6 = pcVar7;
    }
    goto LAB_00468dfb;
  case ':':
    return this->TokenTrans[0x15];
  case ';':
    return this->TokenTrans[0x16];
  case '<':
    *sourcep = pcVar6 + -5;
    if (pcVar6[-6] != '<') {
      return 0;
    }
    *sourcep = pcVar6 + -4;
    if (pcVar6[-5] == '=') {
      return this->TokenTrans[0x17];
    }
    break;
  case '=':
    return this->TokenTrans[0x11];
  case '>':
    *sourcep = pcVar6 + -5;
    if (pcVar6[-6] != '>') {
      return 0;
    }
    *sourcep = pcVar6 + -4;
    if (pcVar6[-5] == '=') {
      return this->TokenTrans[0x18];
    }
    break;
  default:
    if (cVar1 == '[') {
      iVar3 = this->TokenTrans[0x12];
    }
    else if (cVar1 == ']') {
      iVar3 = this->TokenTrans[0x13];
    }
    else if (cVar1 == '^') {
      iVar3 = this->TokenTrans[2];
    }
    else if (cVar1 == '{') {
      iVar3 = this->TokenTrans[0xf];
    }
    else if (cVar1 == '|') {
      *sourcep = pcVar6 + -5;
      if (pcVar6[-6] == '=') {
        iVar3 = this->TokenTrans[0x14];
      }
      else {
        *sourcep = pcVar6 + -6;
        iVar3 = this->TokenTrans[1];
      }
    }
    else if (cVar1 == '}') {
      iVar3 = this->TokenTrans[0xe];
    }
    goto switchD_00468e80_caseD_24;
  }
  *sourcep = pcVar6 + -5;
  return 0;
LAB_00468fb7:
  if (lVar11 == 0x50) goto LAB_00469278;
  *sourcep = pcVar6 + 1;
  cVar1 = *pcVar6;
  iVar8 = (int)cVar1;
  iVar10 = isalnum(iVar8);
  if ((iVar8 != 0x5f) && (iVar10 == 0)) {
    token[lVar11 + -1] = '\0';
    pcVar6 = pcVar6 + 1;
    goto LAB_004692ad;
  }
  token[lVar11 + -1] = cVar1;
  lVar11 = lVar11 + 1;
  pcVar6 = pcVar6 + 1;
  goto LAB_00468fb7;
  while (pcVar7 = pcVar6, cVar1 != '\n') {
LAB_00468e95:
    pcVar6 = pcVar7 + 1;
    *sourcep = pcVar6;
    cVar1 = *pcVar7;
    if (cVar1 == '\0') goto LAB_00468dfb;
  }
  iVar10 = iVar10 + 1;
  this->SourceLine = iVar10;
  goto LAB_00468dfb;
code_r0x00468e2a:
  iVar10 = iVar10 + 1;
  this->SourceLine = iVar10;
  pcVar6 = pcVar6 + -6;
  goto LAB_00468dfb;
LAB_00469278:
  token[0x4f] = '\0';
  iVar10 = isalnum(iVar8);
  while (iVar10 != 0) {
    *sourcep = pcVar6 + 1;
    iVar10 = isalnum((int)*pcVar6);
    pcVar6 = pcVar6 + 1;
  }
LAB_004692ad:
  *sourcep = pcVar6 + -1;
  piVar9 = &buildup;
  iVar10 = (*this->_vptr_FParseContext[2])(this,token,piVar9);
  if ((char)iVar10 == '\0') {
    bVar2 = FindSym(this,token,&yylval->symval);
    if (bVar2) {
      yylval->val = yylval->symval->Value;
    }
    else {
      iVar10 = P_FindLineSpecial(token,(int *)0x0,(int *)0x0);
      yylval->val = iVar10;
      if (iVar10 == 0) {
        strcpy(yylval->sym,token);
        piVar9 = this->TokenTrans + 0xd;
        goto LAB_00469335;
      }
    }
    piVar9 = this->TokenTrans + 9;
  }
LAB_00469335:
  iVar3 = *piVar9;
switchD_00468e80_caseD_24:
  return iVar3;
}

Assistant:

int FParseContext::GetToken (char *&sourcep, FParseToken *yylval)
{
	char token[80];
	int toksize;
	int c;

loop:
	while (isspace (c = *sourcep++) && c != 0)
	{
		if (c == '\n')
			SourceLine++;
	}

	if (c == 0)
	{
		return 0;
	}
	if (isdigit (c))
	{
		int buildup = c - '0';
		if (c == '0')
		{
			c = *sourcep++;
			if (c == 'x' || c == 'X')
			{
				yylval->val = (int)strtol(sourcep, &sourcep, 16);
				return TokenTrans[NUM];
			}
			else
			{
				sourcep--;
			}
		}
		char *endp;

		sourcep--;
		yylval->val = (int)strtol(sourcep, &endp, 10);
		if (*endp == '.')
		{
			// It's a float
			yylval->fval = strtod(sourcep, &sourcep);
			return TokenTrans[FLOATVAL];
		}
		else
		{
			sourcep = endp;
			return TokenTrans[NUM];
		}
	}
	if (isalpha (c))
	{
		int buildup = 0;
		
		token[0] = c;
		toksize = 1;
		while (toksize < 79 && (isalnum (c = *sourcep++) || c == '_'))
		{
			token[toksize++] = c;
		}
		token[toksize] = 0;
		if (toksize == 79 && isalnum (c))
		{
			while (isalnum (c = *sourcep++))
				;
		}
		sourcep--;
		if (FindToken (token, &buildup))
		{
			return buildup;
		}
		if (FindSym (token, &yylval->symval))
		{
			yylval->val = yylval->symval->Value;
			return TokenTrans[NUM];
		}
		if ((yylval->val = P_FindLineSpecial(token)) != 0)
		{
			return TokenTrans[NUM];
		}
#if __GNUC__ == 4 && __GNUC_MINOR__ == 8
		// Work around GCC 4.8 bug 54570 causing release build crashes.
		asm("" : "+g" (yylval));
#endif
		strcpy (yylval->sym, token);
		return TokenTrans[SYM];
	}
	if (c == '/')
	{
		c = *sourcep++;
		if (c == '*')
		{
			for (;;)
			{
				while ((c = *sourcep++) != '*' && c != 0)
				{
					if (c == '\n')
						SourceLine++;
				}
				if (c == 0)
					return 0;
				if ((c = *sourcep++) == '/')
					goto loop;
				if (c == 0)
					return 0;
				sourcep--;
			}
		}
		else if (c == '/')
		{
			while ((c = *sourcep++) != '\n' && c != 0)
				;
			if (c == '\n')
				SourceLine++;
			else if (c == EOF)
				return 0;
			goto loop;
		}
		else
		{
			sourcep--;
			return TokenTrans[DIVIDE];
		}
	}
	if (c == '"')
	{
		int tokensize = 0;
		while ((c = *sourcep++) != '"' && c != 0)
		{
			yylval->string[tokensize++] = c;
		}
		yylval->string[tokensize] = 0;
		return TokenTrans[STRING];
	}
	if (c == '|')
	{
		c = *sourcep++;
		if (c == '=')
			return TokenTrans[OR_EQUAL];
		sourcep--;
		return TokenTrans[OR];
	}
	if (c == '<')
	{
		c = *sourcep++;
		if (c == '<')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[LSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '>')
	{
		c = *sourcep++;
		if (c == '>')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[RSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '#')
	{
		if (!strnicmp(sourcep, "include", 7))
		{
			sourcep+=7;
			return TokenTrans[INCLUDE];
		}
		if (!strnicmp(sourcep, "define", 6))
		{
			sourcep+=6;
			return TokenTrans[DEFINE];
		}
	}
	switch (c)
	{
	case '^': return TokenTrans[XOR];
	case '&': return TokenTrans[AND];
	case '-': return TokenTrans[MINUS];
	case '+': return TokenTrans[PLUS];
	case '*': return TokenTrans[MULTIPLY];
	case '%': return TokenTrans[MODULUS];
	case '(': return TokenTrans[LPAREN];
	case ')': return TokenTrans[RPAREN];
	case ',': return TokenTrans[COMMA];
	case '{': return TokenTrans[LBRACE];
	case '}': return TokenTrans[RBRACE];
	case '=': return TokenTrans[EQUALS];
	case ';': return TokenTrans[SEMICOLON];
	case ':': return TokenTrans[COLON];
	case '[': return TokenTrans[LBRACKET];
	case ']': return TokenTrans[RBRACKET];
	default:  return 0;
	}
}